

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
          (cmExportFileGenerator *this,cmTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  string prepro;
  allocator local_71;
  string local_70;
  string local_50;
  
  bVar1 = cmTarget::IsLinkable(target);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_70,"INTERFACE_LINK_LIBRARIES",(allocator *)&local_50);
    pcVar2 = cmTarget::GetProperty(target,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_50,pcVar2,&local_71);
      cmGeneratorExpression::Preprocess(&local_70,&local_50,preprocessRule,false);
      std::__cxx11::string::~string((string *)&local_50);
      if (local_70._M_string_length != 0) {
        ResolveTargetsInGeneratorExpressions
                  (this,&local_70,target,missingTargets,ReplaceFreeTargets);
        std::__cxx11::string::string((string *)&local_50,"INTERFACE_LINK_LIBRARIES",&local_71);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_50);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        return true;
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return false;
}

Assistant:

bool cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty(
                      cmTarget *target,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  if(!target->IsLinkable())
    {
    return false;
    }
  const char *input = target->GetProperty("INTERFACE_LINK_LIBRARIES");
  if (input)
    {
    std::string prepro = cmGeneratorExpression::Preprocess(input,
                                                           preprocessRule);
    if (!prepro.empty())
      {
      this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                 missingTargets,
                                                 ReplaceFreeTargets);
      properties["INTERFACE_LINK_LIBRARIES"] = prepro;
      return true;
      }
    }
  return false;
}